

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O1

int rebalance(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  vmd_bst_node_t *pvVar1;
  vmd_bst_node_t *pvVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  vmd_bst_node_t *child_3;
  char cVar8;
  uint uVar9;
  vmd_bst_node_t *child_1;
  vmd_bst_node_t *child_2;
  char cVar10;
  int iVar11;
  char cVar12;
  vmd_bst_node_t *child;
  vmd_bst_node_t *pvVar13;
  vmd_bst_node_t *child_4;
  
  cVar12 = node->field_0x20 << 5;
  iVar11 = 0;
  if (2 < (byte)((cVar12 >> 5) + 1U)) {
    bVar3 = cVar12 < '\x01';
    pvVar1 = node->child[bVar3];
    cVar10 = pvVar1->field_0x20 << 5;
    bVar6 = '\0' < (char)(pvVar1->field_0x20 << 5) == '\0' < cVar12;
    pvVar13 = pvVar1;
    if (cVar10 != '\0' && !bVar6) {
      pvVar13 = pvVar1->child['\0' < cVar12];
    }
    pvVar2 = node->parent;
    uVar9 = (byte)node->field_0x20 >> 3 & 1;
    pvVar2->child[uVar9] = pvVar13;
    if (pvVar13 != (vmd_bst_node_t *)0x0) {
      pvVar13->parent = pvVar2;
      pvVar13->field_0x20 = pvVar13->field_0x20 & 0xf7 | (char)uVar9 << 3;
    }
    pvVar2 = pvVar13->child['\0' < cVar12];
    node->child[bVar3] = pvVar2;
    if (pvVar2 != (vmd_bst_node_t *)0x0) {
      pvVar2->parent = node;
      pvVar2->field_0x20 = pvVar2->field_0x20 & 0xf7 | (cVar12 < '\x01') << 3;
    }
    bVar4 = '\0' < cVar12;
    pvVar13->child[bVar4] = node;
    node->parent = pvVar13;
    node->field_0x20 = node->field_0x20 & 0xf7 | bVar4 << 3;
    if (cVar10 == '\0' || bVar6) {
      if ((pvVar1->field_0x20 & 7) == 0) {
        if (cVar12 < '\x01') {
          node->field_0x20 = node->field_0x20 | 7;
          pvVar1->field_0x20 = (pvVar1->field_0x20 & 0xf8) + 1;
        }
        else {
          node->field_0x20 = (node->field_0x20 & 0xf8) + 1;
          pvVar1->field_0x20 = pvVar1->field_0x20 | 7;
        }
      }
      else {
        pvVar1->field_0x20 = pvVar1->field_0x20 & 0xf8;
        node->field_0x20 = node->field_0x20 & 0xf8;
      }
    }
    else {
      pvVar2 = pvVar13->child[bVar3];
      pvVar1->child[bVar4] = pvVar2;
      if (pvVar2 != (vmd_bst_node_t *)0x0) {
        pvVar2->parent = pvVar1;
        pvVar2->field_0x20 = pvVar2->field_0x20 & 0xf7 | ('\0' < cVar12) << 3;
      }
      pvVar13->child[bVar3] = pvVar1;
      if (pvVar1 != (vmd_bst_node_t *)0x0) {
        pvVar1->parent = pvVar13;
        pvVar1->field_0x20 = pvVar1->field_0x20 & 0xf7 | (cVar12 < '\x01') << 3;
      }
      if (tree->upd != (vmd_bst_upd_t)0x0) {
        (*tree->upd)(pvVar1);
      }
      node->field_0x20 = node->field_0x20 & 0xf8;
      bVar7 = pvVar1->field_0x20 & 0xf8;
      pvVar1->field_0x20 = bVar7;
      cVar8 = pvVar13->field_0x20 * ' ';
      if (cVar8 != '\0') {
        bVar5 = -pvVar13->field_0x20;
        if ('\0' < cVar12 == cVar8 < ' ') {
          pvVar1->field_0x20 = bVar5 & 7 | bVar7;
        }
        else {
          node->field_0x20 = node->field_0x20 & 0xf8 | bVar5 & 7;
        }
        pvVar13->field_0x20 = pvVar13->field_0x20 & 0xf8;
      }
    }
    iVar11 = (int)(cVar10 >> 5);
    if (((vmd_bst_t *)node != tree) && (tree->upd != (vmd_bst_upd_t)0x0)) {
      do {
        (*tree->upd)(node);
        node = (((vmd_bst_t *)node)->head).parent;
      } while ((vmd_bst_t *)node != tree);
    }
  }
  return iVar11;
}

Assistant:

static int
rebalance(bst_t *tree, bst_node_t *node)
{
	if (node->balance >= -1 && node->balance <= 1)
		return 0;

	int dir = node->balance > 0;
	bst_node_t *c = node->child[!dir];
	int dbl = c->balance && ((node->balance > 0) != (c->balance > 0));
	bst_node_t *r = dbl ? c->child[dir] : c;

	/* rotation doesn't change the subtree height if c->balance == 0 */
	int ret = c->balance;

	set_child(node->parent, node->idx, r);
	set_child(node, !dir, r->child[dir]);
	set_child(r, dir, node);

	if (dbl) {
		set_child(c, dir, r->child[!dir]);
		set_child(r, !dir, c);

		if (tree->upd)
			tree->upd(c);

		node->balance = 0;
		c->balance = 0;
		if (r->balance) {
			if (dir == (r->balance > 0))
				node->balance = -(r->balance);
			else
				c->balance = -(r->balance);
			r->balance = 0;
		}
	} else {
		if (c->balance)
			node->balance = c->balance = 0;
		else if (dir) {
			node->balance = 1;
			c->balance = -1;
		} else {
			node->balance = -1;
			c->balance = 1;
		}
	}

	update_to_top(tree, node);

	return ret;
}